

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void highbd_blend_a64_d16_mask_w4_avx2
               (uint16_t *dst,int dst_stride,CONV_BUF_TYPE *src0,int src0_stride,CONV_BUF_TYPE *src1
               ,int src1_stride,__m256i *mask0,__m256i *round_offset,int shift,__m256i *clip_low,
               __m256i *clip_high,__m256i *mask_max)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  int in_ESI;
  long lVar7;
  void *in_RDI;
  long in_R8;
  int in_R9D;
  undefined8 in_XMM0_Qa;
  undefined8 uVar8;
  undefined8 in_XMM0_Qb;
  undefined8 uVar9;
  undefined8 in_YMM0_H;
  undefined8 uVar10;
  undefined8 in_register_00001218;
  undefined8 uVar11;
  __m128i v;
  __m128i v_00;
  __m128i v_01;
  __m128i v_02;
  __m128i clipl;
  undefined4 in_stack_00000024;
  __m256i pack;
  __m256i roundl;
  __m256i roundh;
  __m256i suml;
  __m256i sumh;
  __m256i mul1l;
  __m256i mul1h;
  __m256i mul1_lows;
  __m256i mul1_highs;
  __m256i mul0l;
  __m256i mul0h;
  __m256i mul0_lows;
  __m256i mul0_highs;
  __m256i mask1;
  __m256i s1;
  __m256i s0;
  undefined1 local_750 [16];
  undefined8 local_740;
  undefined1 in_stack_fffffffffffff8e0 [32];
  longlong extraout_RDX;
  
  yy_loadu_4x64(in_stack_fffffffffffff8e0._16_8_,in_stack_fffffffffffff8e0._8_8_,
                in_stack_fffffffffffff8e0._0_8_,local_740);
  lVar7 = in_R8 + (long)(in_R9D * 2) * 2;
  uVar8 = in_XMM0_Qa;
  uVar9 = in_XMM0_Qb;
  uVar10 = in_YMM0_H;
  uVar11 = in_register_00001218;
  yy_loadu_4x64(in_stack_fffffffffffff8e0._16_8_,in_stack_fffffffffffff8e0._8_8_,
                in_stack_fffffffffffff8e0._0_8_,local_740);
  auVar3 = vpsubw_avx2((undefined1  [32])*clip_high,*(undefined1 (*) [32])clipl[1]);
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = in_XMM0_Qa;
  auVar2._16_8_ = in_YMM0_H;
  auVar2._24_8_ = in_register_00001218;
  auVar1 = vpmulhuw_avx2(*(undefined1 (*) [32])clipl[1],auVar2);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar4._16_8_ = in_YMM0_H;
  auVar4._24_8_ = in_register_00001218;
  auVar2 = vpmullw_avx2(*(undefined1 (*) [32])clipl[1],auVar4);
  auVar4 = vpunpckhwd_avx2(auVar2,auVar1);
  auVar5 = vpunpcklwd_avx2(auVar2,auVar1);
  auVar1._8_8_ = uVar9;
  auVar1._0_8_ = uVar8;
  auVar1._16_8_ = uVar10;
  auVar1._24_8_ = uVar11;
  auVar1 = vpmulhuw_avx2(auVar3,auVar1);
  auVar6._8_8_ = uVar9;
  auVar6._0_8_ = uVar8;
  auVar6._16_8_ = uVar10;
  auVar6._24_8_ = uVar11;
  auVar2 = vpmullw_avx2(auVar3,auVar6);
  auVar3 = vpunpckhwd_avx2(auVar2,auVar1);
  auVar2 = vpunpcklwd_avx2(auVar2,auVar1);
  auVar1 = vpaddd_avx2(auVar4,auVar3);
  auVar2 = vpaddd_avx2(auVar5,auVar2);
  auVar1 = vpsubd_avx2(auVar1,(undefined1  [32])*mask0);
  auVar1 = vpsrad_avx2(auVar1,ZEXT416((uint)round_offset));
  auVar2 = vpsubd_avx2(auVar2,(undefined1  [32])*mask0);
  auVar2 = vpsrad_avx2(auVar2,ZEXT416((uint)round_offset));
  auVar1 = vpackssdw_avx2(auVar2,auVar1);
  auVar1 = vpmaxsw_avx2(auVar1,*(undefined1 (*) [32])CONCAT44(in_stack_00000024,shift));
  auVar1 = vpminsw_avx2(auVar1,(undefined1  [32])*clip_low);
  vpsrldq_avx(local_750,8);
  v[1]._0_4_ = in_ESI;
  v[0] = lVar7;
  v[1]._4_4_ = 0;
  xx_storel_64((void *)((long)in_RDI + (long)(in_ESI * 3) * 2),v);
  v_00[1] = extraout_RDX;
  v_00[0] = lVar7;
  xx_storel_64((void *)((long)in_RDI + (long)(in_ESI * 2) * 2),v_00);
  vpsrldq_avx(auVar1._16_16_,8);
  v_01[1] = extraout_RDX_00;
  v_01[0] = lVar7;
  xx_storel_64((void *)((long)in_RDI + (long)in_ESI * 2),v_01);
  v_02[1] = extraout_RDX_01;
  v_02[0] = lVar7;
  xx_storel_64(in_RDI,v_02);
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_w4_avx2(
    uint16_t *dst, int dst_stride, const CONV_BUF_TYPE *src0, int src0_stride,
    const CONV_BUF_TYPE *src1, int src1_stride, const __m256i *mask0,
    const __m256i *round_offset, int shift, const __m256i *clip_low,
    const __m256i *clip_high, const __m256i *mask_max) {
  // Load 4x u16 pixels from each of 4 rows from each source
  const __m256i s0 =
      yy_loadu_4x64(src0 + 3 * src0_stride, src0 + 2 * src0_stride,
                    src0 + 1 * src0_stride, src0 + 0 * src0_stride);
  const __m256i s1 =
      yy_loadu_4x64(src1 + 3 * src1_stride, src1 + 2 * src1_stride,
                    src1 + 1 * src1_stride, src1 + 0 * src1_stride);
  // Generate the inverse mask
  const __m256i mask1 = _mm256_sub_epi16(*mask_max, *mask0);

  // Multiply each mask by the respective source
  const __m256i mul0_highs = _mm256_mulhi_epu16(*mask0, s0);
  const __m256i mul0_lows = _mm256_mullo_epi16(*mask0, s0);
  const __m256i mul0h = _mm256_unpackhi_epi16(mul0_lows, mul0_highs);
  const __m256i mul0l = _mm256_unpacklo_epi16(mul0_lows, mul0_highs);
  // Note that AVX2 unpack orders 64-bit words as [3 1] [2 0] to keep within
  // lanes Later, packs does the same again which cancels this out with no need
  // for a permute.  The intermediate values being reordered makes no difference

  const __m256i mul1_highs = _mm256_mulhi_epu16(mask1, s1);
  const __m256i mul1_lows = _mm256_mullo_epi16(mask1, s1);
  const __m256i mul1h = _mm256_unpackhi_epi16(mul1_lows, mul1_highs);
  const __m256i mul1l = _mm256_unpacklo_epi16(mul1_lows, mul1_highs);

  const __m256i sumh = _mm256_add_epi32(mul0h, mul1h);
  const __m256i suml = _mm256_add_epi32(mul0l, mul1l);

  const __m256i roundh =
      _mm256_srai_epi32(_mm256_sub_epi32(sumh, *round_offset), shift);
  const __m256i roundl =
      _mm256_srai_epi32(_mm256_sub_epi32(suml, *round_offset), shift);

  const __m256i pack = _mm256_packs_epi32(roundl, roundh);
  const __m256i clip =
      _mm256_min_epi16(_mm256_max_epi16(pack, *clip_low), *clip_high);

  // _mm256_extract_epi64 doesn't exist on x86, so do it the old-fashioned way:
  const __m128i cliph = _mm256_extracti128_si256(clip, 1);
  xx_storel_64(dst + 3 * dst_stride, _mm_srli_si128(cliph, 8));
  xx_storel_64(dst + 2 * dst_stride, cliph);
  const __m128i clipl = _mm256_castsi256_si128(clip);
  xx_storel_64(dst + 1 * dst_stride, _mm_srli_si128(clipl, 8));
  xx_storel_64(dst + 0 * dst_stride, clipl);
}